

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void leveldb::_Test_RepeatedWritesToSameKey::_RunIt(void)

{
  undefined1 local_a8 [8];
  _Test_RepeatedWritesToSameKey t;
  
  _Test_RepeatedWritesToSameKey((_Test_RepeatedWritesToSameKey *)local_a8);
  _Run((_Test_RepeatedWritesToSameKey *)local_a8);
  ~_Test_RepeatedWritesToSameKey((_Test_RepeatedWritesToSameKey *)local_a8);
  return;
}

Assistant:

TEST(DBTest, RepeatedWritesToSameKey) {
  Options options = CurrentOptions();
  options.env = env_;
  options.write_buffer_size = 100000;  // Small write buffer
  Reopen(&options);

  // We must have at most one file per level except for level-0,
  // which may have up to kL0_StopWritesTrigger files.
  const int kMaxFiles = config::kNumLevels + config::kL0_StopWritesTrigger;

  Random rnd(301);
  std::string value = RandomString(&rnd, 2 * options.write_buffer_size);
  for (int i = 0; i < 5 * kMaxFiles; i++) {
    Put("key", value);
    ASSERT_LE(TotalTableFiles(), kMaxFiles);
    fprintf(stderr, "after %d: %d files\n", i + 1, TotalTableFiles());
  }
}